

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::IntType::printTo(IntType *this,ostream *out)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(out,"IntType(");
  poVar1 = std::operator<<(out,"bitWidth=");
  duckdb_apache::thrift::to_string<signed_char>(&local_40,&this->bitWidth);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"isSigned=");
  duckdb_apache::thrift::to_string<bool>(&local_40,&this->isSigned);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(out,")");
  return;
}

Assistant:

void IntType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "IntType(";
  out << "bitWidth=" << to_string(bitWidth);
  out << ", " << "isSigned=" << to_string(isSigned);
  out << ")";
}